

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_rtext.c
# Opt level: O3

void rtext_free(_rtext *x)

{
  t_editor *ptVar1;
  _rtext *p_Var2;
  _rtext **pp_Var3;
  _rtext *p_Var4;
  
  ptVar1 = x->x_glist->gl_editor;
  if (ptVar1->e_textedfor == x) {
    ptVar1->e_textedfor = (_rtext *)0x0;
  }
  p_Var2 = ptVar1->e_rtext;
  if (ptVar1->e_rtext == x) {
    pp_Var3 = &ptVar1->e_rtext;
  }
  else {
    do {
      p_Var4 = p_Var2;
      if (p_Var4 == (_rtext *)0x0) goto LAB_001528d3;
      p_Var2 = p_Var4->x_next;
    } while (p_Var4->x_next != x);
    pp_Var3 = &p_Var4->x_next;
  }
  *pp_Var3 = x->x_next;
LAB_001528d3:
  freebytes(x->x_buf,(long)x->x_bufsize + 1);
  freebytes(x,0x78);
  return;
}

Assistant:

void rtext_free(t_rtext *x)
{
    if (x->x_glist->gl_editor->e_textedfor == x)
        x->x_glist->gl_editor->e_textedfor = 0;
    if (x->x_glist->gl_editor->e_rtext == x)
        x->x_glist->gl_editor->e_rtext = x->x_next;
    else
    {
        t_rtext *e2;
        for (e2 = x->x_glist->gl_editor->e_rtext; e2; e2 = e2->x_next)
            if (e2->x_next == x)
        {
            e2->x_next = x->x_next;
            break;
        }
    }
    freebytes(x->x_buf, x->x_bufsize + 1); /* extra 0 byte */
    freebytes(x, sizeof *x);
}